

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  QLatin1String *pQVar1;
  long lVar2;
  long lVar3;
  char16_t *pcVar4;
  QChar *pQVar5;
  
  lVar2 = (p->a).a.a.a.d.size;
  if (lVar2 != 0) {
    pcVar4 = (p->a).a.a.a.d.ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar4,lVar2 * 2);
  }
  pQVar5 = *out;
  *out = pQVar5 + lVar2;
  pQVar1 = &(p->a).a.a.b;
  lVar3 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar5 + lVar2);
  pQVar5 = *out + lVar3;
  *out = pQVar5;
  lVar2 = (p->a).a.b.d.size;
  if (lVar2 != 0) {
    pcVar4 = (p->a).a.b.d.ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar5,pcVar4,lVar2 * 2);
    pQVar5 = *out;
  }
  *out = pQVar5 + lVar2;
  pQVar1 = &(p->a).b;
  lVar3 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar5 + lVar2);
  pQVar5 = *out + lVar3;
  *out = pQVar5;
  lVar2 = (p->b).d.size;
  if (lVar2 != 0) {
    pcVar4 = (p->b).d.ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar5,pcVar4,lVar2 * 2);
    pQVar5 = *out;
  }
  *out = pQVar5 + lVar2;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }